

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrSat.c
# Opt level: O0

void Pdr_ManCollectValues(Pdr_Man_t *p,int k,Vec_Int_t *vObjIds,Vec_Int_t *vValues)

{
  Aig_Man_t *p_00;
  int iVar1;
  sat_solver *s;
  Aig_Obj_t *pObj_00;
  int local_40;
  int i;
  int iVar;
  Aig_Obj_t *pObj;
  sat_solver *pSat;
  Vec_Int_t *vValues_local;
  Vec_Int_t *vObjIds_local;
  int k_local;
  Pdr_Man_t *p_local;
  
  Vec_IntClear(vValues);
  s = Pdr_ManSolver(p,k);
  local_40 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vObjIds);
    if (iVar1 <= local_40) {
      return;
    }
    p_00 = p->pAig;
    iVar1 = Vec_IntEntry(vObjIds,local_40);
    pObj_00 = Aig_ManObj(p_00,iVar1);
    iVar1 = Pdr_ObjSatVar(p,k,3,pObj_00);
    if (iVar1 < 0) break;
    iVar1 = sat_solver_var_value(s,iVar1);
    Vec_IntPush(vValues,iVar1);
    local_40 = local_40 + 1;
  }
  __assert_fail("iVar >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrSat.c"
                ,0xf5,"void Pdr_ManCollectValues(Pdr_Man_t *, int, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

void Pdr_ManCollectValues( Pdr_Man_t * p, int k, Vec_Int_t * vObjIds, Vec_Int_t * vValues )
{
    sat_solver * pSat;
    Aig_Obj_t * pObj;
    int iVar, i;
    Vec_IntClear( vValues );
    pSat = Pdr_ManSolver(p, k);
    Aig_ManForEachObjVec( vObjIds, p->pAig, pObj, i )
    {
        iVar = Pdr_ObjSatVar( p, k, 3, pObj ); assert( iVar >= 0 );
        Vec_IntPush( vValues, sat_solver_var_value(pSat, iVar) );
    }
}